

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlDocPtr xmlReadIO(xmlInputReadCallback ioread,xmlInputCloseCallback ioclose,void *ioctx,char *URL,
                   char *encoding,int options)

{
  xmlParserInputBufferPtr in;
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr value;
  xmlDocPtr pxVar1;
  
  if (ioread != (xmlInputReadCallback)0x0) {
    xmlInitParser();
    in = xmlParserInputBufferCreateIO(ioread,ioclose,ioctx,XML_CHAR_ENCODING_NONE);
    if (in == (xmlParserInputBufferPtr)0x0) {
      if (ioclose != (xmlInputCloseCallback)0x0) {
        (*ioclose)(ioctx);
      }
    }
    else {
      ctxt = xmlNewParserCtxt();
      if (ctxt == (xmlParserCtxtPtr)0x0) {
        xmlFreeParserInputBuffer(in);
      }
      else {
        value = xmlNewIOInputStream(ctxt,in,XML_CHAR_ENCODING_NONE);
        if (value != (xmlParserInputPtr)0x0) {
          inputPush(ctxt,value);
          pxVar1 = xmlDoRead(ctxt,URL,encoding,options,0);
          return pxVar1;
        }
        xmlFreeParserInputBuffer(in);
        xmlFreeParserCtxt(ctxt);
      }
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlReadIO(xmlInputReadCallback ioread, xmlInputCloseCallback ioclose,
          void *ioctx, const char *URL, const char *encoding, int options)
{
    xmlParserCtxtPtr ctxt;
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (ioread == NULL)
        return (NULL);
    xmlInitParser();

    input = xmlParserInputBufferCreateIO(ioread, ioclose, ioctx,
                                         XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
        if (ioclose != NULL)
            ioclose(ioctx);
        return (NULL);
    }
    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
        xmlFreeParserInputBuffer(input);
	xmlFreeParserCtxt(ctxt);
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (xmlDoRead(ctxt, URL, encoding, options, 0));
}